

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void Memory::
     DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>
               (AllocatorType *allocator,SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *obj,
               size_t plusSize,bool prefix)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  unsigned_long uVar4;
  size_t sVar5;
  long *plVar6;
  long extraout_RDX;
  code *local_58;
  FreeFuncType freeFunc;
  bool prefix_local;
  size_t plusSize_local;
  SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *obj_local;
  AllocatorType *allocator_local;
  
  if (!prefix) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x13c,"(prefix)","prefix");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  SmallLeafHeapBlockT<SmallAllocationBlockAttributes>::~SmallLeafHeapBlockT(obj);
  if (plusSize + 0x110 < 0x110) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x141,"(sizeof(T) + plusSize >= sizeof(T))",
                       "sizeof(T) + plusSize >= sizeof(T)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  uVar4 = Math::Align<unsigned_long>(plusSize,8);
  if (plusSize != uVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x144,"(plusSize == Math::Align<size_t>(plusSize, sizeof(size_t)))",
                       "plusSize == Math::Align<size_t>(plusSize, sizeof(size_t))");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_58 = (code *)TypeAllocatorFunc<Memory::HeapAllocator,_Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>
                     ::GetFreeFunc();
  plVar6 = (long *)((long)&allocator->m_privateHeap + extraout_RDX);
  if (((ulong)local_58 & 1) != 0) {
    local_58 = *(code **)(local_58 + *plVar6 + -1);
  }
  sVar5 = _AllocatorDelete<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>,_(Memory::AllocatorDeleteFlags)0>
          ::Size(plusSize);
  (*local_58)(plVar6,(long)obj - plusSize,sVar5);
  return;
}

Assistant:

void DeleteObject(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, T * obj, size_t plusSize, bool prefix)
{
    Assert(prefix);
    obj->~T();

    // DeleteObject can only be called when an object is allocated successfully.
    // So the add should never overflow
    Assert(sizeof(T) + plusSize >= sizeof(T));

    // NOTE: This may cause the object not be double aligned
    Assert(plusSize == Math::Align<size_t>(plusSize, sizeof(size_t)));

    auto freeFunc = AllocatorInfo<TAllocator, T>::InstAllocatorFunc::GetFreeFunc(); // Use InstAllocatorFunc
    (allocator->*freeFunc)(((char *)obj) - plusSize,
        _AllocatorDelete<T, deleteFlags>::Size(plusSize));
}